

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

void cf_aes_encrypt(cf_aes_context *ctx,uint8_t *in,uint8_t *out)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t *puVar10;
  uint32_t state [4];
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint8_t *local_38;
  
  uVar1 = ctx->rounds;
  if ((uVar1 < 0xf) && ((0x5400U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar3 = *(uint *)in;
    uVar4 = *(uint *)(in + 4);
    uVar5 = *(uint *)(in + 8);
    uVar6 = *(uint *)(in + 0xc);
    local_48 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ^
               ctx->ks[0];
    local_44 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) ^
               ctx->ks[1];
    local_40 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) ^
               ctx->ks[2];
    local_3c = (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) ^
               ctx->ks[3];
    puVar10 = ctx->ks + 4;
    local_38 = out;
    if (1 < uVar1) {
      iVar2 = uVar1 - 1;
      do {
        sub_block(&local_48);
        shift_rows(&local_48);
        uVar1 = (local_48 >> 7 & 0x1010101) * 0x1b ^ local_48 * 2 & 0xfefefefe;
        uVar9 = uVar1 ^ local_48;
        uVar4 = (local_44 >> 7 & 0x1010101) * 0x1b ^ local_44 * 2 & 0xfefefefe;
        uVar7 = uVar4 ^ local_44;
        uVar5 = (local_40 >> 7 & 0x1010101) * 0x1b ^ local_40 * 2 & 0xfefefefe;
        uVar3 = uVar5 ^ local_40;
        uVar8 = (local_3c >> 7 & 0x1010101) * 0x1b ^ local_3c * 2 & 0xfefefefe;
        uVar6 = uVar8 ^ local_3c;
        local_48 = (local_48 << 0x18 | local_48 >> 8) ^ (local_48 << 0x10 | local_48 >> 0x10) ^
                   uVar1 ^ (uVar9 << 8 | uVar9 >> 0x18) ^ *puVar10;
        local_44 = (local_44 << 0x18 | local_44 >> 8) ^ (local_44 << 0x10 | local_44 >> 0x10) ^
                   uVar4 ^ (uVar7 << 8 | uVar7 >> 0x18) ^ puVar10[1];
        local_40 = (local_40 << 0x18 | local_40 >> 8) ^ (local_40 << 0x10 | local_40 >> 0x10) ^
                   uVar5 ^ (uVar3 << 8 | uVar3 >> 0x18) ^ puVar10[2];
        local_3c = (local_3c << 0x18 | local_3c >> 8) ^ (local_3c << 0x10 | local_3c >> 0x10) ^
                   uVar8 ^ (uVar6 << 8 | uVar6 >> 0x18) ^ puVar10[3];
        puVar10 = puVar10 + 4;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    sub_block(&local_48);
    shift_rows(&local_48);
    local_48 = local_48 ^ *puVar10;
    local_44 = local_44 ^ puVar10[1];
    local_40 = local_40 ^ puVar10[2];
    local_3c = local_3c ^ puVar10[3];
    *local_38 = (uint8_t)(local_48 >> 0x18);
    local_38[1] = (uint8_t)(local_48 >> 0x10);
    local_38[2] = (uint8_t)(local_48 >> 8);
    local_38[3] = (uint8_t)local_48;
    local_38[4] = (uint8_t)(local_44 >> 0x18);
    local_38[5] = (uint8_t)(local_44 >> 0x10);
    local_38[6] = (uint8_t)(local_44 >> 8);
    local_38[7] = (uint8_t)local_44;
    local_38[8] = (uint8_t)(local_40 >> 0x18);
    local_38[9] = (uint8_t)(local_40 >> 0x10);
    local_38[10] = (uint8_t)(local_40 >> 8);
    local_38[0xb] = (uint8_t)local_40;
    local_38[0xc] = (uint8_t)(local_3c >> 0x18);
    local_38[0xd] = (uint8_t)(local_3c >> 0x10);
    local_38[0xe] = (uint8_t)(local_3c >> 8);
    local_38[0xf] = (uint8_t)local_3c;
    return;
  }
  abort();
}

Assistant:

void cf_aes_encrypt(const cf_aes_context *ctx,
                    const uint8_t in[AES_BLOCKSZ],
                    uint8_t out[AES_BLOCKSZ])
{
  assert(ctx->rounds == AES128_ROUNDS ||
         ctx->rounds == AES192_ROUNDS ||
         ctx->rounds == AES256_ROUNDS);

  uint32_t state[4] = {
    read32_be(in + 0),
    read32_be(in + 4),
    read32_be(in + 8),
    read32_be(in + 12)
  };

  const uint32_t *round_keys = ctx->ks;
  add_round_key(state, round_keys);
  round_keys += 4;

  for (uint32_t round = 1; round < ctx->rounds; round++)
  {
    sub_block(state);
    shift_rows(state);
    mix_columns(state);
    add_round_key(state, round_keys);
    round_keys += 4;
  }

  sub_block(state);
  shift_rows(state);
  add_round_key(state, round_keys);

  write32_be(state[0], out + 0);
  write32_be(state[1], out + 4);
  write32_be(state[2], out + 8);
  write32_be(state[3], out + 12);
}